

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PType::VisitedNodeSet::Insert(VisitedNodeSet *this,PType *node)

{
  PType *pPVar1;
  PType **ppPVar2;
  PType **ppPVar3;
  
  ppPVar2 = (PType **)((long)this->Buckets + (ulong)((uint)((ulong)node >> 1) & 0xf8));
  ppPVar3 = ppPVar2;
  do {
    pPVar1 = *ppPVar3;
    if (pPVar1 == node) break;
    ppPVar3 = &pPVar1->VisitNext;
  } while (pPVar1 != (PType *)0x0);
  if (pPVar1 == (PType *)0x0) {
    node->VisitNext = *ppPVar2;
    *ppPVar2 = node;
    return;
  }
  __assert_fail("!Check(node) && \"Node was already inserted\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0x174,"void PType::VisitedNodeSet::Insert(PType *)");
}

Assistant:

void PType::VisitedNodeSet::Insert(PType *node)
{
	assert(!Check(node) && "Node was already inserted");
	size_t buck = Hash(node) & (countof(Buckets) - 1);
	node->VisitNext = Buckets[buck];
	Buckets[buck] = node;
}